

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataExpression.cpp
# Opt level: O3

bool __thiscall Rml::DataInterpreter::Run(DataInterpreter *this)

{
  pointer pVVar1;
  pointer pVVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  bool bVar5;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar6;
  ulong uVar7;
  pointer pIVar8;
  undefined1 *puVar9;
  Program *pPVar10;
  long lVar11;
  size_t next_instruction;
  String program_str;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_c0;
  size_type local_b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  undefined1 *local_78;
  undefined8 local_70;
  undefined1 local_68;
  undefined7 uStack_67;
  String local_58;
  DataInterpreter *local_38;
  
  paVar3 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)0x0;
  do {
    paVar6 = paVar3;
    pIVar8 = (this->program->
             super__Vector_base<Rml::InstructionData,_std::allocator<Rml::InstructionData>_>).
             _M_impl.super__Vector_impl_data._M_start;
    puVar9 = (undefined1 *)
             (((long)(this->program->
                     super__Vector_base<Rml::InstructionData,_std::allocator<Rml::InstructionData>_>
                     )._M_impl.super__Vector_impl_data._M_finish - (long)pIVar8 >> 4) *
             -0x5555555555555555);
    if (puVar9 <= paVar6) {
      pVVar1 = (this->stack).super__Vector_base<Rml::Variant,_std::allocator<Rml::Variant>_>._M_impl
               .super__Vector_impl_data._M_start;
      pVVar2 = (this->stack).super__Vector_base<Rml::Variant,_std::allocator<Rml::Variant>_>._M_impl
               .super__Vector_impl_data._M_finish;
      if (pVVar1 != pVVar2) {
        Log::Message(LT_WARNING,
                     "Possible data interpreter stack corruption. Stack size is %zu at end of execution (should be zero)."
                     ,((long)pVVar2 - (long)pVVar1 >> 3) * -0x3333333333333333);
      }
      goto LAB_001f3e79;
    }
    local_c0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(paVar6->_M_local_buf + 1);
    pIVar8 = pIVar8 + (long)paVar6;
    bVar5 = Execute(this,pIVar8->instruction,&pIVar8->data,(size_t *)&local_c0);
    paVar3 = local_c0;
  } while (bVar5);
  pPVar10 = this->program;
  local_78 = &local_68;
  local_70 = 0;
  local_68 = 0;
  pIVar8 = (pPVar10->super__Vector_base<Rml::InstructionData,_std::allocator<Rml::InstructionData>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((pPVar10->super__Vector_base<Rml::InstructionData,_std::allocator<Rml::InstructionData>_>).
      _M_impl.super__Vector_impl_data._M_finish != pIVar8) {
    paVar3 = &local_98.field_2;
    local_a0 = &local_b0;
    lVar11 = 8;
    uVar7 = 0;
    local_38 = this;
    do {
      local_98._M_string_length = 0;
      local_98.field_2._M_allocated_capacity._0_4_ =
           local_98.field_2._M_allocated_capacity._0_4_ & 0xffffff00;
      local_98._M_dataplus._M_p = (pointer)paVar3;
      Variant::
      GetInto<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                ((Variant *)((pIVar8->data).data + lVar11 + -0x10),&local_98);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p == paVar3) {
        local_b0._8_4_ = local_98.field_2._8_4_;
        local_b0._12_4_ = local_98.field_2._12_4_;
        local_98._M_dataplus._M_p = (pointer)&local_b0;
      }
      local_b0._M_allocated_capacity._4_4_ = local_98.field_2._M_allocated_capacity._4_4_;
      local_b0._M_allocated_capacity._0_4_ = local_98.field_2._M_allocated_capacity._0_4_;
      local_b8 = local_98._M_string_length;
      local_98._M_string_length = 0;
      local_98.field_2._M_allocated_capacity._0_4_ =
           local_98.field_2._M_allocated_capacity._0_4_ & 0xffffff00;
      local_c0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)local_98._M_dataplus._M_p;
      paVar4 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)local_98._M_dataplus._M_p;
      local_98._M_dataplus._M_p = (pointer)paVar3;
      CreateString_abi_cxx11_
                (&local_58,"  %4zu  \'%c\'  %s\n",uVar7,
                 (ulong)(uint)(int)(((pPVar10->
                                     super__Vector_base<Rml::InstructionData,_std::allocator<Rml::InstructionData>_>
                                     )._M_impl.super__Vector_impl_data._M_start)->data).data
                                   [lVar11 + 0xffffffffffffffe8],paVar4);
      ::std::__cxx11::string::_M_append((char *)&local_78,(ulong)local_58._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != &local_58.field_2) {
        operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
      }
      if (local_c0 != &local_b0) {
        operator_delete(local_c0,local_b0._M_allocated_capacity + 1);
      }
      uVar7 = uVar7 + 1;
      pIVar8 = (pPVar10->
               super__Vector_base<Rml::InstructionData,_std::allocator<Rml::InstructionData>_>).
               _M_impl.super__Vector_impl_data._M_start;
      lVar11 = lVar11 + 0x30;
    } while (uVar7 < (ulong)(((long)(pPVar10->
                                    super__Vector_base<Rml::InstructionData,_std::allocator<Rml::InstructionData>_>
                                    )._M_impl.super__Vector_impl_data._M_finish - (long)pIVar8 >> 4)
                            * -0x5555555555555555));
    pPVar10 = local_38->program;
  }
  Log::Message(LT_WARNING,"Failed to execute program with %zu instructions:",
               ((long)(pPVar10->
                      super__Vector_base<Rml::InstructionData,_std::allocator<Rml::InstructionData>_>
                      )._M_impl.super__Vector_impl_data._M_finish -
                (long)(pPVar10->
                      super__Vector_base<Rml::InstructionData,_std::allocator<Rml::InstructionData>_>
                      )._M_impl.super__Vector_impl_data._M_start >> 4) * -0x5555555555555555);
  Log::Message(LT_WARNING,"%s",local_78);
  if (local_78 != &local_68) {
    operator_delete(local_78,CONCAT71(uStack_67,local_68) + 1);
  }
LAB_001f3e79:
  return puVar9 <= paVar6;
}

Assistant:

bool Run()
	{
		bool success = true;
		size_t i = 0;
		while (i < program.size())
		{
			size_t next_instruction = i + 1;
			if (!Execute(program[i].instruction, program[i].data, next_instruction))
			{
				success = false;
				break;
			}
			i = next_instruction;
		}

		if (success && !stack.empty())
			Log::Message(Log::LT_WARNING, "Possible data interpreter stack corruption. Stack size is %zu at end of execution (should be zero).",
				stack.size());

		if (!success)
		{
			String program_str = DumpProgram(program);
			Log::Message(Log::LT_WARNING, "Failed to execute program with %zu instructions:", program.size());
			Log::Message(Log::LT_WARNING, "%s", program_str.c_str());
		}

		return success;
	}